

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase149::run(TestCase149 *this)

{
  int iVar1;
  bool bVar2;
  void *firstElement;
  TestObject *ptrCopy;
  long lVar3;
  size_t elementCount;
  Array<kj::(anonymous_namespace)::TestObject> array;
  int local_6c;
  void *local_68;
  long lStack_60;
  long local_58;
  undefined8 *local_50;
  void *local_48;
  size_t sStack_40;
  undefined8 *local_38;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  local_48 = (void *)0x0;
  sStack_40 = 0;
  local_38 = (undefined8 *)0x0;
  firstElement = _::HeapArrayDisposer::allocateImpl
                           (4,0,0x20,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58 = (long)firstElement + 0x80;
  local_50 = &_::HeapArrayDisposer::instance;
  local_6c = 0;
  lVar3 = 0;
  local_68 = firstElement;
  do {
    if ((local_6c != (anonymous_namespace)::TestObject::count) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44],int&,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x9f,ERROR,
                 "\"failed: expected \" \"(i) == (TestObject::count)\", i, TestObject::count",
                 (char (*) [44])"failed: expected (i) == (TestObject::count)",&local_6c,
                 &(anonymous_namespace)::TestObject::count);
    }
    TestObject::TestObject((TestObject *)((long)firstElement + lVar3));
    iVar1 = local_6c + 1;
    lVar3 = lVar3 + 4;
    bVar2 = local_6c < 0x1f;
    local_6c = iVar1;
  } while (bVar2);
  lStack_60 = (long)firstElement + lVar3;
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_6c = 0x20;
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_6c,
               &(anonymous_namespace)::TestObject::count);
  }
  elementCount = lVar3 >> 2;
  local_68 = (void *)0x0;
  lStack_60 = 0;
  local_58 = 0;
  local_38 = &_::HeapArrayDisposer::instance;
  local_48 = firstElement;
  sStack_40 = elementCount;
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_6c = 0x20;
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_6c,
               &(anonymous_namespace)::TestObject::count);
  }
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_68 = (void *)CONCAT44(local_68._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_68,
               &(anonymous_namespace)::TestObject::count);
  }
  if (firstElement != (void *)0x0) {
    local_48 = (void *)0x0;
    sStack_40 = 0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,4,elementCount,
               elementCount,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject,_false>::destruct);
  }
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_68 = (void *)((ulong)local_68 & 0xffffffff00000000);
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_68,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(Array, AraryBuilder) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array;

  {
    ArrayBuilder<TestObject> builder = heapArrayBuilder<TestObject>(32);

    for (int i = 0; i < 32; i++) {
      EXPECT_EQ(i, TestObject::count);
      builder.add();
    }

    EXPECT_EQ(32, TestObject::count);
    array = builder.finish();
    EXPECT_EQ(32, TestObject::count);
  }

  EXPECT_EQ(32, TestObject::count);
  array = nullptr;
  EXPECT_EQ(0, TestObject::count);
}